

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O1

string * __thiscall
particleSamples::gz_readline_abi_cxx11_
          (string *__return_storage_ptr__,particleSamples *this,gzFile gzfp)

{
  int iVar1;
  char buffer [1];
  stringstream line;
  char local_1b2;
  char local_1b1;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  iVar1 = gzread(gzfp,&local_1b2,1);
  while ((iVar1 == 1 && (local_1b2 != '\n'))) {
    local_1b1 = local_1b2;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1b1,1);
    iVar1 = gzread(gzfp,&local_1b2,1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string particleSamples::gz_readline(gzFile gzfp) {
    std::stringstream line;
    char buffer[1];
    int len = gzread(gzfp, buffer, 1);
    while (len == 1 && buffer[0] != '\n') {
        line << buffer[0];
        len = gzread(gzfp, buffer, 1);
    }
    return (line.str());
}